

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::Clara::CommandLine<Catch::ConfigData>::Arg::~Arg(Arg *this)

{
  pointer pcVar1;
  IArgFunction<Catch::ConfigData> *pIVar2;
  
  pcVar1 = (this->super_OptionArgProperties).longName._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_OptionArgProperties).longName.field_2) {
    operator_delete(pcVar1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->super_OptionArgProperties).shortNames);
  pcVar1 = (this->super_CommonArgProperties<Catch::ConfigData>).placeholder._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_CommonArgProperties<Catch::ConfigData>).placeholder.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->super_CommonArgProperties<Catch::ConfigData>).detail._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_CommonArgProperties<Catch::ConfigData>).detail.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->super_CommonArgProperties<Catch::ConfigData>).description._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_CommonArgProperties<Catch::ConfigData>).description.field_2) {
    operator_delete(pcVar1);
  }
  pIVar2 = (this->super_CommonArgProperties<Catch::ConfigData>).boundField.functionObj;
  if (pIVar2 != (IArgFunction<Catch::ConfigData> *)0x0) {
    (*pIVar2->_vptr_IArgFunction[1])();
    return;
  }
  return;
}

Assistant:

Arg() {}